

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

void armci_msg_rcv(int tag,void *buffer,int len,int *msglen,int from)

{
  int iVar1;
  int iVar2;
  MPI_Comm poVar3;
  long in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int in_EDI;
  int in_R8D;
  int rc;
  int flag;
  int self;
  MPI_Status status;
  MPI_Request request;
  MPI_Comm comm;
  int local_58;
  int local_54;
  undefined1 local_50 [24];
  undefined1 local_38 [8];
  MPI_Comm local_30;
  int local_24;
  long local_20;
  undefined4 local_14;
  undefined8 local_10;
  int local_4;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  local_30 = wc();
  local_58 = 0;
  iVar1 = MPI_Comm_rank(local_30,&local_54);
  iVar2 = local_24;
  if (iVar1 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,399,"void armci_msg_rcv(int, void *, int, int *, int)");
  }
  if (local_4 == 0x6be8) {
    __assert_fail("COMEX_TAG != tag",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x191,"void armci_msg_rcv(int, void *, int, int *, int)");
  }
  poVar3 = wc();
  iVar2 = MPI_Irecv(local_10,local_14,&ompi_mpi_char,iVar2,local_4,poVar3,local_38);
  if (iVar2 != 0) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x194,"void armci_msg_rcv(int, void *, int, int *, int)");
  }
  if ((local_24 == local_54) && (self_request_flag != 0)) {
    do {
      MPI_Test(&self_request,&local_58,local_50);
      comex_make_progress();
    } while (local_58 == 0);
    self_request = (MPI_Request)&ompi_request_null;
    self_request_flag = 0;
  }
  do {
    MPI_Test(local_38,&local_58,local_50);
    comex_make_progress();
  } while (local_58 == 0);
  if ((local_20 != 0) && (iVar2 = MPI_Get_count(local_50,&ompi_mpi_char,local_20), iVar2 != 0)) {
    __assert_fail("MPI_SUCCESS == rc",
                  "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/comex/src-armci/message.c"
                  ,0x1aa,"void armci_msg_rcv(int, void *, int, int *, int)");
  }
  return;
}

Assistant:

void armci_msg_rcv(int tag, void* buffer, int len, int *msglen, int from)
{
    MPI_Comm comm = wc();
    MPI_Request request;
    MPI_Status status;
    int self;
    int flag = 0;
    int rc;

    rc = MPI_Comm_rank(comm, &self);
    assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
    assert(COMEX_TAG != tag);
#endif
    rc = MPI_Irecv(buffer, len, MPI_CHAR, from, tag, wc(), &request);
    assert(MPI_SUCCESS == rc);
    if (from == self && self_request_flag) {
        do {
            MPI_Test(&self_request, &flag, &status);
            assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
            comex_make_progress();
#endif
        } while (!flag);
        self_request = MPI_REQUEST_NULL;
        self_request_flag = 0;
    }
    do {
        MPI_Test(&request, &flag, &status);
        assert(MPI_SUCCESS == rc);
#if COMEX_NETWORK_MPI_TS
        comex_make_progress();
#endif
    } while (!flag);

    if(msglen) {
        rc = MPI_Get_count(&status, MPI_CHAR, msglen);
        assert(MPI_SUCCESS == rc);
    }
}